

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O2

size_t prt_level_feeling(wchar_t row,wchar_t col)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  size_t sVar4;
  char *src;
  uint8_t attr;
  uint uVar5;
  char obj_feeling_str [6];
  char mon_feeling_str [6];
  
  if (((player->opts).opt[0x25] != true) || (player->depth == 0)) {
    return 0;
  }
  bVar1 = cave->feeling;
  bVar3 = bVar1 / 10;
  if (cave->feeling_squares < z_info->feeling_need) {
    my_strcpy(obj_feeling_str,"?",6);
    attr = '\x01';
  }
  else {
    attr = "\x01\n\f\x03\v\v\r\r\r\x0e\x0e"[(uint)bVar3];
    if (bVar1 < 10) {
      src = "*";
    }
    else {
      if (9 < bVar1 - 10) {
        strnfmt(obj_feeling_str,5,"%d",(ulong)(0xb - bVar3));
        goto LAB_001b2276;
      }
      src = "$";
    }
    my_strcpy(obj_feeling_str,src,6);
  }
LAB_001b2276:
  uVar5 = (uint)bVar3 * 0xfff6 + (uint)bVar1 & 0xffff;
  if (uVar5 == 0) {
    my_strcpy(mon_feeling_str,"?",6);
  }
  else {
    strnfmt(mon_feeling_str,5,"%d",(ulong)(10 - uVar5));
  }
  c_put_str('\x01',"LF:",row,col);
  c_put_str("\x01\x04\x03\x03\v\v\x05\x05\x06\x06"[uVar5],mon_feeling_str,row,col + L'\x03');
  sVar4 = strlen(mon_feeling_str);
  iVar2 = (int)sVar4;
  c_put_str('\x01',"-",row,col + iVar2 + L'\x03');
  c_put_str(attr,obj_feeling_str,row,col + iVar2 + L'\x04');
  sVar4 = strlen(obj_feeling_str);
  return (long)((int)sVar4 + iVar2 + 5);
}

Assistant:

static size_t prt_level_feeling(int row, int col)
{
	uint16_t obj_feeling;
	uint16_t mon_feeling;
	char obj_feeling_str[6];
	char mon_feeling_str[6];
	int new_col;
	uint8_t obj_feeling_color_print;

	/* Don't show feelings for cold-hearted characters */
	if (!OPT(player, birth_feelings)) return 0;

	/* No useful feeling in town */
	if (!player->depth) return 0;

	/* Get feelings */
	obj_feeling = cave->feeling / 10;
	mon_feeling = cave->feeling - (10 * obj_feeling);

	/*
	 *   Convert object feeling to a symbol easier to parse
	 * for a human.
	 *   0 -> * "Looks like any other level."
	 *   1 -> $ "you sense an item of wondrous power!" (special feeling)
	 *   2 to 10 are feelings from 2 meaning superb feeling to 10
	 * meaning naught but cobwebs.
	 *   It is easier for the player to have poor feelings as a
	 * low number and superb feelings as a higher one. So for
	 * display we reverse this numbers and subtract 1.
	 *   Thus (2-10) becomes (1-9 reversed)
	 *
	 *   But before that check if the player has explored enough
	 * to get a feeling. If not display as ?
	 */
	if (cave->feeling_squares < z_info->feeling_need) {
		my_strcpy(obj_feeling_str, "?", sizeof(obj_feeling_str));
		obj_feeling_color_print = COLOUR_WHITE;
	} else {
		obj_feeling_color_print = obj_feeling_color[obj_feeling];
		if (obj_feeling == 0)
			my_strcpy(obj_feeling_str, "*", sizeof(obj_feeling_str));
		else if (obj_feeling == 1)
			my_strcpy(obj_feeling_str, "$", sizeof(obj_feeling_str));
		else
			strnfmt(obj_feeling_str, 5, "%d", (unsigned int) (11-obj_feeling));
	}

	/* 
	 *   Convert monster feeling to a symbol easier to parse
	 * for a human.
	 *   0 -> ? . Monster feeling should never be 0, but we check
	 * it just in case.
	 *   1 to 9 are feelings from omens of death to quiet, paceful.
	 * We also reverse this so that what we show is a danger feeling.
	 */
	if (mon_feeling == 0)
		my_strcpy( mon_feeling_str, "?", sizeof(mon_feeling_str) );
	else
		strnfmt(mon_feeling_str, 5, "%d", (unsigned int) ( 10-mon_feeling ));

	/* Display it */
	c_put_str(COLOUR_WHITE, "LF:", row, col);
	new_col = col + 3;
	c_put_str(mon_feeling_color[mon_feeling], mon_feeling_str, row, new_col);
	new_col += strlen( mon_feeling_str );
	c_put_str(COLOUR_WHITE, "-", row, new_col);
	++new_col;
	c_put_str(obj_feeling_color_print, obj_feeling_str,	row, new_col);
	new_col += strlen( obj_feeling_str ) + 1;

	return new_col - col;
}